

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

nn_optset * nn_ws_optset(void)

{
  nn_optset *extraout_RAX;
  nn_optset *pnVar1;
  void *ptr;
  
  ptr = (void *)0x10;
  pnVar1 = (nn_optset *)nn_alloc_(0x10);
  if (pnVar1 != (nn_optset *)0x0) {
    pnVar1->vfptr = &nn_ws_optset_vfptr;
    *(undefined4 *)&pnVar1[1].vfptr = 2;
    return pnVar1;
  }
  nn_ws_optset_cold_1();
  nn_free(ptr);
  return extraout_RAX;
}

Assistant:

static struct nn_optset *nn_ws_optset ()
{
    struct nn_ws_optset *optset;

    optset = nn_alloc (sizeof (struct nn_ws_optset), "optset (ws)");
    alloc_assert (optset);
    optset->base.vfptr = &nn_ws_optset_vfptr;

    /*  Default values for WebSocket options. */
    optset->msg_type = NN_WS_MSG_TYPE_BINARY;

    return &optset->base;   
}